

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall timer::notify(timer *this,time_point now)

{
  const_iterator __position;
  _Base_ptr p_Var1;
  
  while (((this->queue)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 &&
         (__position._M_node = (this->queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
         *(long *)(__position._M_node + 1) <= (long)now.__d.__r))) {
    p_Var1 = __position._M_node[1]._M_parent;
    *(undefined8 *)p_Var1 = 0;
    std::function<void_()>::operator()((function<void_()> *)&p_Var1->_M_right);
    std::
    _Rb_tree<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>,std::_Identity<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>>,std::less<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>,std::_Identity<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>>,std::less<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>>>
                        *)this,__position);
  }
  return;
}

Assistant:

void timer::notify(clock_t::time_point now)
{
    for (;;)
    {
        if (queue.empty())
            break;

        auto i = queue.begin();
        if (i->first > now)
            break;

        i->second->t = nullptr;
        try
        {
            i->second->callback();
        }
        catch (std::exception const& e)
        {
            std::cerr << "error: " << e.what() << std::endl;
        }
        catch (...)
        {
            std::cerr << "unknown exception in timer::notify()" << std::endl;
        }

        queue.erase(i);
    }
}